

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O0

void __thiscall Omega_h::Adj::~Adj(Adj *this)

{
  Adj *this_local;
  
  Read<signed_char>::~Read(&this->codes);
  Graph::~Graph(&this->super_Graph);
  return;
}

Assistant:

OMEGA_H_INLINE Adj() {}